

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_seal(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int freeze_flag)

{
  JSValue val;
  JSValue JVar1;
  int iVar2;
  JSObject *in_RDX;
  JSContext *unaff_RBX;
  undefined8 in_RSI;
  JSContext *in_RDI;
  JSValue *in_R8;
  int in_R9D;
  JSValue JVar3;
  JSAtom in_stack_00000044;
  JSObject *in_stack_00000048;
  JSPropertyDescriptor *in_stack_00000050;
  JSContext *in_stack_00000058;
  JSAtom prop;
  JSPropertyDescriptor desc;
  int res;
  int desc_flags;
  int flags;
  uint32_t i;
  uint32_t len;
  JSPropertyEnum *props;
  JSObject *p;
  JSValue obj;
  int64_t in_stack_00000100;
  undefined1 in_stack_00000108 [16];
  JSValue in_stack_00000220;
  JSValue in_stack_00000230;
  int in_stack_00000240;
  JSContext *in_stack_fffffffffffffee8;
  JSValueUnion in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  uint uStack_dc;
  uint local_70;
  uint local_6c;
  int flags_00;
  long lVar5;
  undefined1 in_stack_ffffffffffffffe8 [16];
  JSValue JVar4;
  
  flags_00 = (int)((ulong)in_RSI >> 0x20);
  JVar4 = *in_R8;
  JVar1 = *in_R8;
  iVar2 = JS_IsObject(*in_R8);
  if (iVar2 == 0) {
    JVar3 = JS_DupValue(in_RDI,JVar1);
  }
  else {
    JVar1.tag = in_stack_fffffffffffffef8;
    JVar1.u.ptr = in_stack_fffffffffffffef0.ptr;
    iVar2 = JS_PreventExtensions(in_stack_fffffffffffffee8,JVar1);
    if (iVar2 < 0) {
      JVar3.u.ptr = (void *)(in_stack_ffffffffffffffe8._4_8_ << 0x20);
      JVar3.tag = 6;
    }
    else if (iVar2 == 0) {
      JVar3 = JS_ThrowTypeError(in_RDI,"proxy preventExtensions handler returned false");
    }
    else {
      iVar2 = JS_GetOwnPropertyNamesInternal
                        (unaff_RBX,in_stack_ffffffffffffffe8._8_8_,in_stack_ffffffffffffffe8._0_8_,
                         in_RDX,flags_00);
      if (iVar2 == 0) {
        for (local_70 = 0; local_70 < local_6c; local_70 = local_70 + 1) {
          if (in_R9D != 0) {
            iVar2 = JS_GetOwnPropertyInternal
                              (in_stack_00000058,in_stack_00000050,in_stack_00000048,
                               in_stack_00000044);
            lVar5 = in_stack_ffffffffffffffe8._4_8_;
            if (iVar2 < 0) goto LAB_0014e7c4;
            if (iVar2 != 0) {
              js_free_desc((JSContext *)in_stack_fffffffffffffef0.ptr,
                           (JSPropertyDescriptor *)in_stack_fffffffffffffee8);
            }
          }
          in_stack_fffffffffffffee8 = (JSContext *)((ulong)uStack_dc << 0x20);
          in_stack_fffffffffffffef0.float64 = 1.48219693752374e-323;
          val.tag = in_stack_00000100;
          val.u = (JSValueUnion)this_val.tag;
          iVar2 = JS_DefineProperty((JSContext *)this_val.u.ptr,(JSValue)in_stack_00000108,ctx._4_4_
                                    ,val,in_stack_00000220,in_stack_00000230,in_stack_00000240);
          lVar5 = in_stack_ffffffffffffffe8._4_8_;
          if (iVar2 < 0) {
LAB_0014e7c4:
            js_free_prop_enum((JSContext *)in_stack_fffffffffffffef0.ptr,
                              (JSPropertyEnum *)in_stack_fffffffffffffee8,0);
            JVar4.u.ptr = (void *)(lVar5 << 0x20);
            JVar4.tag = 6;
            return JVar4;
          }
        }
        js_free_prop_enum((JSContext *)in_stack_fffffffffffffef0.ptr,
                          (JSPropertyEnum *)in_stack_fffffffffffffee8,0);
        JVar3 = JS_DupValue(in_RDI,JVar4);
      }
      else {
        JVar3.u.ptr = (void *)(in_stack_ffffffffffffffe8._4_8_ << 0x20);
        JVar3.tag = 6;
      }
    }
  }
  return JVar3;
}

Assistant:

static JSValue js_object_seal(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int freeze_flag)
{
    JSValueConst obj = argv[0];
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;
    int flags, desc_flags, res;

    if (!JS_IsObject(obj))
        return JS_DupValue(ctx, obj);

    res = JS_PreventExtensions(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    if (!res) {
        return JS_ThrowTypeError(ctx, "proxy preventExtensions handler returned false");
    }
    
    p = JS_VALUE_GET_OBJ(obj);
    flags = JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK;
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p, flags))
        return JS_EXCEPTION;

    for(i = 0; i < len; i++) {
        JSPropertyDescriptor desc;
        JSAtom prop = props[i].atom;

        desc_flags = JS_PROP_THROW | JS_PROP_HAS_CONFIGURABLE;
        if (freeze_flag) {
            res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
            if (res < 0)
                goto exception;
            if (res) {
                if (desc.flags & JS_PROP_WRITABLE)
                    desc_flags |= JS_PROP_HAS_WRITABLE;
                js_free_desc(ctx, &desc);
            }
        }
        if (JS_DefineProperty(ctx, obj, prop, JS_UNDEFINED,
                              JS_UNDEFINED, JS_UNDEFINED, desc_flags) < 0)
            goto exception;
    }
    js_free_prop_enum(ctx, props, len);
    return JS_DupValue(ctx, obj);

 exception:
    js_free_prop_enum(ctx, props, len);
    return JS_EXCEPTION;
}